

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O1

int raviV_compile(lua_State *L,Proto *p,ravi_compile_options_t *options)

{
  ushort uVar1;
  global_State *pgVar2;
  ravi_State *prVar3;
  char *s;
  byte bVar4;
  _Bool _Var5;
  size_t len;
  lua_CFunction p_Var6;
  byte bVar7;
  int iVar8;
  lu_byte lVar9;
  membuff_t buf;
  char fname [30];
  membuff_t local_70;
  char local_58 [40];
  
  lVar9 = (p->ravi_jit).jit_status;
  if (lVar9 == '\x02') {
    iVar8 = 1;
  }
  else if (lVar9 == '\x01') {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    if (options != (ravi_compile_options_t *)0x0) {
      pgVar2 = L->l_G;
      prVar3 = pgVar2->ravi_state;
      if ((prVar3 != (ravi_State *)0x0) && (prVar3->jit != (MIR_context_t)0x0)) {
        bVar4 = *(byte *)options & 1;
        bVar7 = bVar4;
        if (((bVar4 == 0) &&
            ((((prVar3->field_0x10 & 8) != 0 && (bVar7 = 1, (p->ravi_jit).jit_flags != '\x01')) &&
             (p->sizecode <= prVar3->min_code_size_)))) &&
           (uVar1 = (p->ravi_jit).execution_count, (int)(uint)uVar1 < prVar3->min_exec_count_)) {
          (p->ravi_jit).execution_count = uVar1 + 1;
          bVar7 = bVar4;
        }
        if (bVar7 != 0) {
          _Var5 = raviJ_cancompile(p);
          if (_Var5) {
            if (pgVar2->ravi_state->compiling_ == 0) {
              pgVar2->ravi_state->compiling_ = 1;
              membuff_init(&local_70,0x1000);
              pgVar2->ravi_state->id = pgVar2->ravi_state->id + 1;
              snprintf(local_58,0x1e,"jit%lld");
              _Var5 = raviJ_codegen(L,p,options,local_58,&local_70);
              s = local_70.buf;
              lVar9 = '\x01';
              iVar8 = 0;
              if (_Var5) {
                if ((((ulong)*options & 1) != 0) && ((pgVar2->ravi_state->field_0x10 & 7) != 0)) {
                  len = strlen(local_70.buf);
                  ravi_writestring(L,s,len);
                  ravi_writeline(L);
                }
                p_Var6 = (lua_CFunction)
                         compile_C_module(&pgVar2->ravi_state->options,pgVar2->ravi_state->jit,
                                          local_70.buf,local_58);
                iVar8 = 0;
                if (p_Var6 != (lua_CFunction)0x0) {
                  (p->ravi_jit).jit_data = (void *)0x0;
                  (p->ravi_jit).jit_function = p_Var6;
                  iVar8 = 1;
                  lVar9 = '\x02';
                }
              }
              (p->ravi_jit).jit_status = lVar9;
              membuff_free(&local_70);
              pgVar2->ravi_state->compiling_ = 0;
            }
          }
          else {
            (p->ravi_jit).jit_status = '\x01';
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int raviV_compile(struct lua_State *L, struct Proto *p, ravi_compile_options_t *options) {
  if (p->ravi_jit.jit_status == RAVI_JIT_COMPILED)
    return true;
  else if (p->ravi_jit.jit_status == RAVI_JIT_CANT_COMPILE)
    return false;
  if (options == NULL)
    return false;

  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return false;
  if (G->ravi_state->jit == NULL)
    return false;

  bool doCompile = (bool)(options && options->manual_request != 0);
  if (!doCompile && G->ravi_state->auto_) {
    if (p->ravi_jit.jit_flags == RAVI_JIT_FLAG_HASFORLOOP) /* function has fornum loop, so compile */
      doCompile = true;
    else if (p->sizecode > G->ravi_state->min_code_size_) /* function is long so compile */
      doCompile = true;
    else {
      if (p->ravi_jit.execution_count < G->ravi_state->min_exec_count_) /* function has been executed many
                                                                                      times so compile */
        p->ravi_jit.execution_count++;
      else
        doCompile = true;
    }
  }
  if (!doCompile) {
    return false;
  }
  if (!raviJ_cancompile(p)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    return false;
  }

  if (G->ravi_state->compiling_)
    return false;
  G->ravi_state->compiling_ = 1;

  membuff_t buf;
  membuff_init(&buf, 4096);

  int (*fp)(lua_State * L) = NULL;
  char fname[30];
  snprintf(fname, sizeof fname, "jit%lld", G->ravi_state->id++);
  if (!raviJ_codegen(L, p, options, fname, &buf)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    goto Lerror;
  }
  if (options->manual_request && G->ravi_state->verbosity_) {
    ravi_writestring(L, buf.buf, strlen(buf.buf));
    ravi_writeline(L);
  }
  fp = compile_C_module(&G->ravi_state->options, G->ravi_state->jit, buf.buf, fname);
  if (!fp) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
  }
  else {
    p->ravi_jit.jit_data = NULL;
    p->ravi_jit.jit_function = fp;
    p->ravi_jit.jit_status = RAVI_JIT_COMPILED;
  }
Lerror:
  membuff_free(&buf);
  G->ravi_state->compiling_ = 0;
  return fp != NULL;
}